

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O3

void __thiscall spvtools::opt::LoopFusion::Fuse(LoopFusion *this)

{
  Loop **__src;
  pointer *pppLVar1;
  Function *pFVar2;
  BasicBlock *this_00;
  long lVar3;
  long lVar4;
  long lVar5;
  Instruction *pIVar6;
  Instruction *pIVar7;
  mapped_type pBVar8;
  CFG *this_01;
  DefUseManager *this_02;
  pointer ppLVar9;
  iterator __position;
  mapped_type pLVar10;
  undefined8 uVar11;
  iterator iVar12;
  bool bVar13;
  char cVar14;
  uint32_t uVar15;
  Analysis AVar16;
  uint32_t uVar17;
  BasicBlock *pBVar18;
  BasicBlock *pBVar19;
  mapped_type *ppBVar20;
  Instruction *pIVar21;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  __dest;
  const_iterator cVar22;
  Loop *pLVar23;
  mapped_type *ppLVar24;
  Loop *pLVar25;
  __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
  __first;
  DebugScope DVar26;
  Loop **ppLVar27;
  Loop *loop;
  Instruction *instruction;
  _Any_data *p_Var28;
  Loop *loop_2;
  IRContext *pIVar29;
  unordered_map<unsigned_int,_spvtools::opt::Loop_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>_>
  *puVar30;
  undefined8 uVar31;
  Instruction **phi_instruction;
  DebugScope DVar32;
  Instruction *pIVar33;
  DebugScope DVar34;
  LoopDescriptor *pLVar35;
  pointer ppLVar36;
  code *pcVar37;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar38;
  __alloc_node_gen_t __alloc_node_gen;
  BasicBlockListTy loop_1_blocks;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> local_110;
  BasicBlock *local_108;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  undefined8 local_e0;
  size_t sStack_d8;
  undefined8 local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  LoopDescriptor *local_a0;
  uint32_t local_98;
  uint32_t local_94;
  uint32_t local_90;
  uint32_t local_8c;
  Instruction *local_88;
  iterator iStack_80;
  Loop **local_78;
  DebugScope local_68;
  DebugScope DStack_60;
  long local_58;
  BasicBlock *local_48;
  uint32_t local_3c;
  BasicBlock *local_38;
  
  bVar13 = AreCompatible(this);
  if (!bVar13) {
    __assert_fail("AreCompatible() && \"Can\'t fuse, loops aren\'t compatible\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp"
                  ,0x216,"void spvtools::opt::LoopFusion::Fuse()");
  }
  bVar13 = IsLegal(this);
  if (!bVar13) {
    __assert_fail("IsLegal() && \"Can\'t fuse, illegal\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp"
                  ,0x217,"void spvtools::opt::LoopFusion::Fuse()");
  }
  pLVar23 = this->loop_1_;
  pIVar21 = (pLVar23->loop_header_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_98 = 0;
  local_8c = 0;
  if (pIVar21->has_result_id_ == true) {
    local_8c = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
    pLVar23 = this->loop_1_;
  }
  pBVar18 = Loop::FindConditionBlock(pLVar23);
  pIVar21 = (pBVar18->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar21->has_result_id_ == true) {
    local_98 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  pIVar21 = (this->loop_1_->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar15 = 0;
  local_94 = 0;
  if (pIVar21->has_result_id_ == true) {
    local_94 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  pLVar23 = this->loop_0_;
  pIVar21 = (pLVar23->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar21->has_result_id_ == true) {
    uVar15 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
    pLVar23 = this->loop_0_;
  }
  pBVar19 = Loop::FindConditionBlock(pLVar23);
  pFVar2 = this->containing_function_;
  UVar38 = std::
           __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                     (&pFVar2->blocks_,
                      (pFVar2->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,&pFVar2->blocks_,
                      (pFVar2->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_98);
  pBVar18 = UVar38.iterator_._M_current._M_current[1]._M_t.
            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  pFVar2 = this->containing_function_;
  UVar38 = std::
           __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                     (&pFVar2->blocks_,
                      (pFVar2->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,&pFVar2->blocks_,
                      (pFVar2->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_94);
  this_00 = UVar38.iterator_._M_current._M_current[-1]._M_t.
            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  pFVar2 = this->containing_function_;
  UVar38 = std::
           __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                     (&pFVar2->blocks_,
                      (pFVar2->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,&pFVar2->blocks_,
                      (pFVar2->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,uVar15);
  local_108 = UVar38.iterator_._M_current._M_current[-1]._M_t.
              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  local_100._8_8_ = 0;
  local_e8 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:551:7)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:551:7)>
             ::_M_manager;
  local_100._M_unused._M_object = pBVar18;
  local_38 = pBVar18;
  BasicBlock::ForEachSuccessorLabel(local_108,(function<void_(unsigned_int_*)> *)&local_100);
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,3);
  }
  local_100._8_8_ = 0;
  local_e8 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:556:7)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:556:7)>
             ::_M_manager;
  local_100._M_unused._M_object = this;
  local_a0 = (LoopDescriptor *)pBVar19;
  local_90 = uVar15;
  BasicBlock::ForEachSuccessorLabel(this_00,(function<void_(unsigned_int_*)> *)&local_100);
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,3);
  }
  pBVar18 = this->loop_0_->loop_header_;
  local_100._M_unused._M_object = &local_c8;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:560:42)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:560:42)>
             ::_M_manager;
  local_100._8_8_ = 0;
  local_e8 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_manager;
  DVar26 = (DebugScope)
           (pBVar18->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_c8._M_unused._M_object = this;
  local_48 = this_00;
  if (DVar26 != (DebugScope)0x0) {
    local_68 = DVar26;
    std::
    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:560:42)>
    ::_M_invoke(&local_c8,(Instruction **)&local_68);
  }
  DVar26 = (DebugScope)
           (pBVar18->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((DVar26 != (DebugScope)0x0) && (*(bool *)((long)DVar26 + 0x18) == false)) {
    do {
      if (DVar26 == (DebugScope)0x0) break;
      DVar34 = *(DebugScope *)((long)DVar26 + 8);
      local_68 = DVar26;
      if (local_f0 == (code *)0x0) goto LAB_005d6323;
      if (*(bool *)((long)DVar34 + 0x18) != false) {
        DVar34.lexical_scope_ = 0;
        DVar34.inlined_at_ = 0;
      }
      cVar14 = (*local_e8)(&local_100,(uint **)&local_68);
      DVar26 = DVar34;
    } while (cVar14 != '\0');
  }
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,3);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  pLVar35 = local_a0;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:568:37)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:568:37)>
             ::_M_manager;
  local_100._8_8_ = 0;
  local_100._M_unused._M_object = &local_c8;
  local_e8 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_manager;
  DVar26 = (DebugScope)
           (((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)((long)local_a0 + 8))->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_c8._M_unused._M_object = this;
  if (DVar26 != (DebugScope)0x0) {
    local_68 = DVar26;
    std::
    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:568:37)>
    ::_M_invoke(&local_c8,(Instruction **)&local_68);
  }
  DVar26 = (DebugScope)
           (((InstructionList *)((long)pLVar35 + 0x10))->
           super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((DVar26 != (DebugScope)0x0) && (*(bool *)((long)DVar26 + 0x18) == false)) {
    do {
      if (DVar26 == (DebugScope)0x0) break;
      DVar32 = *(DebugScope *)((long)DVar26 + 8);
      local_68 = DVar26;
      if (local_f0 == (code *)0x0) goto LAB_005d6323;
      if (*(bool *)((long)DVar32 + 0x18) != false) {
        DVar32.lexical_scope_ = 0;
        DVar32.inlined_at_ = 0;
      }
      cVar14 = (*local_e8)(&local_100,(uint **)&local_68);
      DVar26 = DVar32;
    } while (cVar14 != '\0');
  }
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,3);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  local_68.lexical_scope_ = 0;
  local_68.inlined_at_ = 0;
  DStack_60.lexical_scope_ = 0;
  DStack_60.inlined_at_ = 0;
  local_58 = 0;
  pBVar18 = this->loop_1_->loop_header_;
  p_Var28 = (_Any_data *)
            (pBVar18->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pIVar21 = &(pBVar18->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (p_Var28 != (_Any_data *)pIVar21) {
    do {
      if ((*(int *)(p_Var28->_M_pod_data + 0x28) == 0xf5) &&
         (p_Var28 != (_Any_data *)this->induction_1_)) {
        local_100._M_unused._0_8_ = (undefined8)p_Var28;
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&local_68,(Instruction **)&local_100);
      }
      p_Var28 = *(_Any_data **)((long)p_Var28 + 8);
      DVar26 = local_68;
    } while (p_Var28 != (_Any_data *)pIVar21);
    for (; DVar26 != DStack_60; DVar26 = (DebugScope)((long)DVar26 + 8)) {
      lVar3 = *(long *)DVar26;
      if (*(char *)(lVar3 + 0x18) == '\x01') {
        __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xca,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                     );
      }
      lVar4 = *(long *)(lVar3 + 8);
      if (lVar4 == 0) {
        __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xcc,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                     );
      }
      lVar5 = *(long *)(lVar3 + 0x10);
      *(long *)(lVar4 + 0x10) = lVar5;
      *(long *)(lVar5 + 8) = lVar4;
      *(undefined8 *)(lVar3 + 8) = 0;
      *(undefined8 *)(lVar3 + 0x10) = 0;
      pIVar21 = *(Instruction **)DVar26;
      if ((pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
        __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xae,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                     );
      }
      pIVar33 = this->induction_0_;
      if ((pIVar33->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ ==
          (Instruction *)0x0) {
        __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xaf,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                     );
      }
      pIVar6 = (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if (pIVar6 != (Instruction *)0x0) {
        pIVar7 = (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
        (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar7;
        (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar6;
        (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
             (Instruction *)0x0;
      }
      (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar33;
      (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (pIVar33->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (pIVar33->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar21;
      (((pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar21;
    }
  }
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:596:45)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:596:45)>
             ::_M_manager;
  local_100._8_8_ = 0;
  local_100._M_unused._M_object = &local_c8;
  local_e8 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_manager;
  pIVar21 = (this->loop_0_->loop_header_->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_c8._M_unused._M_object = this;
  if ((pIVar21 == (Instruction *)0x0) ||
     ((pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
LAB_005d5897:
    (*local_f0)(&local_100,&local_100,3);
  }
  else {
    do {
      if (pIVar21 == (Instruction *)0x0) break;
      pIVar33 = (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar33->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar33 = (Instruction *)0x0;
      }
      if (pIVar21->opcode_ != OpPhi) break;
      local_88 = pIVar21;
      if (local_f0 == (code *)0x0) goto LAB_005d6323;
      cVar14 = (*local_e8)(&local_100,(uint **)&local_88);
      pIVar21 = pIVar33;
    } while (cVar14 != '\0');
    if (local_f0 != (code *)0x0) goto LAB_005d5897;
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  DVar26 = DStack_60;
  if (local_68 != DStack_60) {
    DVar34 = local_68;
    do {
      pIVar29 = this->context_;
      local_100._M_unused._0_8_ = (undefined8)*(undefined8 *)DVar34;
      pBVar8 = this->loop_0_->loop_header_;
      AVar16 = pIVar29->valid_analyses_;
      if ((AVar16 & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        ppBVar20 = std::__detail::
                   _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&pIVar29->instr_to_block_,(key_type *)&local_100);
        *ppBVar20 = pBVar8;
        pIVar29 = this->context_;
        AVar16 = pIVar29->valid_analyses_;
      }
      if ((AVar16 & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar29);
      }
      analysis::DefUseManager::AnalyzeInstUse
                ((pIVar29->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,*(Instruction **)DVar34);
      DVar34 = (DebugScope)((long)DVar34 + 8);
    } while (DVar34 != DVar26);
  }
  pIVar29 = this->context_;
  pIVar21 = this->induction_1_;
  uVar17 = 0;
  uVar15 = 0;
  if (pIVar21->has_result_id_ == true) {
    uVar15 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  pLVar35 = local_a0;
  pIVar21 = this->induction_0_;
  if (pIVar21->has_result_id_ == true) {
    uVar17 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  IRContext::ReplaceAllUsesWith(pIVar29,uVar15,uVar17);
  uVar15 = local_90;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:616:44)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:616:44)>
             ::_M_manager;
  local_100._8_8_ = 0;
  local_100._M_unused._M_object = &local_c8;
  local_e8 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_manager;
  pIVar21 = (this->loop_0_->loop_merge_->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_c8._M_unused._M_object = this;
  if ((pIVar21 == (Instruction *)0x0) ||
     ((pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
LAB_005d5a5b:
    (*local_f0)(&local_100,&local_100,3);
  }
  else {
    do {
      if (pIVar21 == (Instruction *)0x0) break;
      pIVar33 = (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar33->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar33 = (Instruction *)0x0;
      }
      if (pIVar21->opcode_ != OpPhi) break;
      local_88 = pIVar21;
      if (local_f0 == (code *)0x0) goto LAB_005d6323;
      cVar14 = (*local_e8)(&local_100,(uint **)&local_88);
      pIVar21 = pIVar33;
    } while (cVar14 != '\0');
    pLVar35 = local_a0;
    if (local_f0 != (code *)0x0) goto LAB_005d5a5b;
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:623:7)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:623:7)>
             ::_M_manager;
  local_100._8_8_ = 0;
  local_100._M_unused._M_object = &local_c8;
  local_e8 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_manager;
  pIVar21 = (this->loop_1_->loop_merge_->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_c8._M_unused._0_8_ = (undefined8)pLVar35;
  if ((pIVar21 != (Instruction *)0x0) &&
     ((pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar21 == (Instruction *)0x0) break;
      pIVar33 = (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar33->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar33 = (Instruction *)0x0;
      }
      if (pIVar21->opcode_ != OpPhi) break;
      local_88 = pIVar21;
      if (local_f0 == (code *)0x0) {
LAB_005d6323:
        std::__throw_bad_function_call();
      }
      cVar14 = (*local_e8)(&local_100,(uint **)&local_88);
      pIVar21 = pIVar33;
    } while (cVar14 != '\0');
    pLVar35 = local_a0;
    if (local_f0 == (code *)0x0) goto LAB_005d5b4a;
  }
  (*local_f0)(&local_100,&local_100,3);
LAB_005d5b4a:
  pBVar18 = local_48;
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  opt::Function::MoveBasicBlockToAfter(this->containing_function_,uVar15,pBVar18);
  local_c8._M_unused._M_object = (undefined8 *)0x0;
  local_c8._8_8_ = (_func_void *)0x0;
  local_b8 = (code *)0x0;
  anon_unknown_21::AddInstructionsInBlock
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_c8,this->loop_1_->loop_preheader_);
  anon_unknown_21::AddInstructionsInBlock
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_c8,this->loop_1_->loop_header_);
  pBVar18 = Loop::FindConditionBlock(this->loop_1_);
  anon_unknown_21::AddInstructionsInBlock
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_c8,pBVar18);
  anon_unknown_21::AddInstructionsInBlock
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_c8,this->loop_1_->loop_continue_);
  pBVar18 = this->loop_0_->loop_merge_;
  if (pBVar18 != this->loop_1_->loop_preheader_) {
    anon_unknown_21::AddInstructionsInBlock
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&local_c8,pBVar18);
  }
  pIVar29 = this->context_;
  if ((pIVar29->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar29);
  }
  this_01 = (pIVar29->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  CFG::ForgetBlock(this_01,this->loop_1_->loop_preheader_);
  CFG::ForgetBlock(this_01,this->loop_1_->loop_header_);
  pBVar18 = Loop::FindConditionBlock(this->loop_1_);
  CFG::ForgetBlock(this_01,pBVar18);
  CFG::ForgetBlock(this_01,this->loop_1_->loop_continue_);
  pBVar18 = this->loop_0_->loop_merge_;
  if (pBVar18 != this->loop_1_->loop_preheader_) {
    CFG::ForgetBlock(this_01,pBVar18);
  }
  pIVar21 = (local_108->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar17 = 0;
  uVar15 = 0;
  if (pIVar21->has_result_id_ == true) {
    uVar15 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  pIVar21 = (this->loop_0_->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar21->has_result_id_ == true) {
    uVar17 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  CFG::RemoveEdge(this_01,uVar15,uVar17);
  pIVar21 = (local_108->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar17 = 0;
  uVar15 = 0;
  if (pIVar21->has_result_id_ == true) {
    uVar15 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  pIVar21 = (local_38->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar21->has_result_id_ == true) {
    uVar17 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  CFG::AddEdge(this_01,uVar15,uVar17);
  pIVar21 = (local_48->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar17 = 0;
  uVar15 = 0;
  if (pIVar21->has_result_id_ == true) {
    uVar15 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  pIVar21 = (this->loop_0_->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar21->has_result_id_ == true) {
    uVar17 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  CFG::AddEdge(this_01,uVar15,uVar17);
  pIVar21 = (this->loop_0_->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar17 = 0;
  uVar15 = 0;
  if (pIVar21->has_result_id_ == true) {
    uVar15 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  pIVar21 = (this->loop_1_->loop_header_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar21->has_result_id_ == true) {
    uVar17 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  CFG::AddEdge(this_01,uVar15,uVar17);
  pIVar21 = (((BasicBlock *)pLVar35)->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar17 = 0;
  uVar15 = 0;
  if (pIVar21->has_result_id_ == true) {
    uVar15 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  pIVar21 = (this->loop_1_->loop_merge_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar21->has_result_id_ == true) {
    uVar17 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  CFG::AddEdge(this_01,uVar15,uVar17);
  pIVar29 = this->context_;
  if ((pIVar29->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar29);
  }
  pBVar18 = local_48;
  pIVar21 = (local_108->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar21 != (Instruction *)0x0) &&
     ((pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    this_02 = (pIVar29->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    analysis::DefUseManager::AnalyzeInstUse
              (this_02,(local_108->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
                       .super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
    pIVar21 = (pBVar18->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar21 != (Instruction *)0x0) &&
       ((pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      analysis::DefUseManager::AnalyzeInstUse
                (this_02,(pBVar18->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
                         .super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
      pIVar21 = BasicBlock::GetLoopMergeInst(this->loop_0_->loop_header_);
      analysis::DefUseManager::AnalyzeInstUse(this_02,pIVar21);
      pIVar21 = (((BasicBlock *)pLVar35)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if ((pIVar21 != (Instruction *)0x0) &&
         ((pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
        analysis::DefUseManager::AnalyzeInstUse
                  (this_02,(((BasicBlock *)pLVar35)->insts_).
                           super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                           super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
        local_a0 = IRContext::GetLoopDescriptor(this->context_,this->containing_function_);
        local_88 = (Instruction *)0x0;
        iStack_80._M_current = (Loop **)0x0;
        local_78 = (Loop **)0x0;
        ppLVar36 = (this->loop_1_->nested_loops_).
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppLVar9 = (this->loop_1_->nested_loops_).
                  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppLVar36 != ppLVar9) {
          do {
            local_100._M_unused._M_object = *ppLVar36;
            if (iStack_80._M_current == local_78) {
              std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
              _M_realloc_insert<spvtools::opt::Loop*const&>
                        ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
                         &local_88,iStack_80,(Loop **)&local_100);
            }
            else {
              *iStack_80._M_current = (Loop *)local_100._M_unused._0_8_;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
            iVar12._M_current = iStack_80._M_current;
            ppLVar36 = ppLVar36 + 1;
          } while (ppLVar36 != ppLVar9);
          if (local_88 != (Instruction *)iStack_80._M_current) {
            pIVar21 = local_88;
            do {
              pLVar23 = (Loop *)(pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                _vptr_IntrusiveNodeBase;
              pLVar25 = this->loop_1_;
              local_100._M_unused._0_8_ = (undefined8)pLVar23;
              __dest = std::
                       __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop*const>>
                                 ((pLVar25->nested_loops_).
                                  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pLVar25->nested_loops_).
                                  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,&local_100);
              __src = __dest._M_current + 1;
              ppLVar27 = (pLVar25->nested_loops_).
                         super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              if (__src != ppLVar27) {
                memmove(__dest._M_current,__src,(long)ppLVar27 - (long)__src);
                ppLVar27 = (pLVar25->nested_loops_).
                           super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              }
              (pLVar25->nested_loops_).
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppLVar27 + -1;
              *(Loop **)(local_100._M_unused._M_function_pointer + 0x30) = (Loop *)0x0;
              pLVar25 = this->loop_0_;
              if (pLVar23->parent_ != (Loop *)0x0) {
                local_100._M_unused._0_8_ = (undefined8)pLVar23;
                __assert_fail("!nested->GetParent() && \"The loop has another parent.\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.h"
                              ,0xaa,"void spvtools::opt::Loop::AddNestedLoop(Loop *)");
              }
              __position._M_current =
                   (pLVar25->nested_loops_).
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (pLVar25->nested_loops_).
                  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_100._M_unused._0_8_ = (undefined8)pLVar23;
                std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
                _M_realloc_insert<spvtools::opt::Loop*const&>
                          ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
                           &pLVar25->nested_loops_,__position,(Loop **)&local_100);
              }
              else {
                *__position._M_current = pLVar23;
                pppLVar1 = &(pLVar25->nested_loops_).
                            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                *pppLVar1 = *pppLVar1 + 1;
                local_100._M_unused._0_8_ = pLVar23;
              }
              ((Loop *)local_100._M_unused._0_8_)->parent_ = pLVar25;
              pIVar21 = (Instruction *)
                        &(pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
            } while (pIVar21 != (Instruction *)iVar12._M_current);
          }
        }
        pLVar23 = this->loop_1_;
        local_100._M_unused._M_object = (void *)0x0;
        local_100._8_8_ = (pLVar23->loop_basic_blocks_)._M_h._M_bucket_count;
        local_f0 = (code *)0x0;
        local_e8 = (code *)(pLVar23->loop_basic_blocks_)._M_h._M_element_count;
        local_e0 = *(undefined8 *)&(pLVar23->loop_basic_blocks_)._M_h._M_rehash_policy;
        sStack_d8 = (pLVar23->loop_basic_blocks_)._M_h._M_rehash_policy._M_next_resize;
        local_d0 = 0;
        local_110._M_h = (__hashtable_alloc *)&local_100;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_110._M_h,&(pLVar23->loop_basic_blocks_)._M_h,&local_110);
        if (local_f0 != (code *)0x0) {
          local_108 = (BasicBlock *)&local_a0->basic_block_to_loop_;
          pcVar37 = local_f0;
          do {
            uVar15 = *(uint32_t *)((long)pcVar37 + 8);
            pLVar23 = this->loop_1_;
            local_110._M_h._0_4_ = uVar15;
            do {
              std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase(&(pLVar23->loop_basic_blocks_)._M_h,&local_110);
              pLVar23 = pLVar23->parent_;
            } while (pLVar23 != (Loop *)0x0);
            if (((uVar15 != local_94) && (uVar15 != local_8c)) && (uVar15 != local_98)) {
              pLVar23 = this->loop_0_;
              local_3c = uVar15;
              do {
                local_110._M_h = (__hashtable_alloc *)&pLVar23->loop_basic_blocks_;
                std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                          (local_110._M_h,
                           (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)&local_3c,&local_110);
                pLVar23 = pLVar23->parent_;
              } while (pLVar23 != (Loop *)0x0);
              local_110._M_h._0_4_ = uVar15;
              cVar22 = std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)local_108,(key_type_conflict *)&local_110);
              if (cVar22.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>
                  ._M_cur == (__node_type *)0x0) {
                pLVar23 = (Loop *)0x0;
              }
              else {
                pLVar23 = *(Loop **)((long)cVar22.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>
                                           ._M_cur + 0x10);
              }
              if (pLVar23 == this->loop_1_) {
                pLVar10 = this->loop_0_;
                local_110._M_h._0_4_ = uVar15;
                ppLVar24 = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_108,(key_type *)&local_110);
                *ppLVar24 = pLVar10;
              }
            }
            local_110._M_h._0_4_ = uVar15;
            cVar22 = std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)local_108,(key_type_conflict *)&local_110);
            if (cVar22.
                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>
                ._M_cur == (__node_type *)0x0) {
              pLVar23 = (Loop *)0x0;
            }
            else {
              pLVar23 = *(Loop **)((long)cVar22.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>
                                         ._M_cur + 0x10);
            }
            if (pLVar23 == this->loop_1_) {
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)local_108,&local_110);
            }
            pcVar37 = *(code **)pcVar37;
          } while (pcVar37 != (code *)0x0);
        }
        pLVar23 = this->loop_1_;
        pIVar21 = (pLVar23->loop_preheader_->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar15 = 0;
        if (pIVar21->has_result_id_ == true) {
          uVar15 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
        }
        pLVar35 = local_a0;
        local_110._M_h._0_4_ = uVar15;
        do {
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(&(pLVar23->loop_basic_blocks_)._M_h,&local_110);
          pLVar23 = pLVar23->parent_;
        } while (pLVar23 != (Loop *)0x0);
        pIVar21 = (this->loop_1_->loop_preheader_->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar15 = 0;
        if (pIVar21->has_result_id_ == true) {
          uVar15 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
        }
        local_110._M_h._0_4_ = uVar15;
        puVar30 = &pLVar35->basic_block_to_loop_;
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&puVar30->_M_h);
        pLVar23 = this->loop_0_;
        pLVar25 = this->loop_1_;
        if (pLVar23->loop_merge_ != pLVar25->loop_preheader_) {
          pIVar21 = (pLVar23->loop_merge_->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar15 = 0;
          if (pIVar21->has_result_id_ == true) {
            uVar15 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
          }
          local_110._M_h._0_4_ = uVar15;
          do {
            std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_erase(&(pLVar23->loop_basic_blocks_)._M_h,&local_110);
            pLVar23 = pLVar23->parent_;
          } while (pLVar23 != (Loop *)0x0);
          pIVar21 = (this->loop_0_->loop_merge_->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar15 = 0;
          if (pIVar21->has_result_id_ == true) {
            uVar15 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
          }
          local_110._M_h._0_4_ = uVar15;
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase(&puVar30->_M_h);
          pLVar23 = this->loop_0_;
          pLVar25 = this->loop_1_;
        }
        Loop::SetMergeBlock(pLVar23,pLVar25->loop_merge_);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear(&(this->loop_1_->loop_basic_blocks_)._M_h);
        LoopDescriptor::RemoveLoop(pLVar35,this->loop_1_);
        uVar11 = local_c8._8_8_;
        for (uVar31 = local_c8._M_unused._0_8_; uVar31 != uVar11; uVar31 = uVar31 + 8) {
          IRContext::KillInst(this->context_,*(Instruction **)uVar31);
        }
        pFVar2 = this->containing_function_;
        __first = std::
                  __remove_if<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::RemoveEmptyBlocks()::_lambda(std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>const&)_1_>>
                            ((pFVar2->blocks_).
                             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (pFVar2->blocks_).
                             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ::_M_erase(&pFVar2->blocks_,(iterator)__first._M_current,
                   (pFVar2->blocks_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        IRContext::InvalidateAnalysesExceptFor
                  (this->context_,
                   kAnalysisLoopAnalysis|kAnalysisCFG|kAnalysisInstrToBlockMapping|kAnalysisBegin);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&local_100);
        if (local_88 != (Instruction *)0x0) {
          operator_delete(local_88,(long)local_78 - (long)local_88);
        }
        if ((_func_void *)local_c8._M_unused._0_8_ != (_func_void *)0x0) {
          operator_delete(local_c8._M_unused._M_object,(long)local_b8 - local_c8._0_8_);
        }
        if (local_68 != (DebugScope)0x0) {
          operator_delete((void *)local_68,local_58 - (long)local_68);
        }
        return;
      }
    }
  }
  __assert_fail("!insts_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
}

Assistant:

void LoopFusion::Fuse() {
  assert(AreCompatible() && "Can't fuse, loops aren't compatible");
  assert(IsLegal() && "Can't fuse, illegal");

  // Save the pointers/ids, won't be found in the middle of doing modifications.
  auto header_1 = loop_1_->GetHeaderBlock()->id();
  auto condition_1 = loop_1_->FindConditionBlock()->id();
  auto continue_1 = loop_1_->GetContinueBlock()->id();
  auto continue_0 = loop_0_->GetContinueBlock()->id();
  auto condition_block_of_0 = loop_0_->FindConditionBlock();

  // Find the blocks whose branches need updating.
  auto first_block_of_1 = &*(++containing_function_->FindBlock(condition_1));
  auto last_block_of_1 = &*(--containing_function_->FindBlock(continue_1));
  auto last_block_of_0 = &*(--containing_function_->FindBlock(continue_0));

  // Update the branch for |last_block_of_loop_0| to go to |first_block_of_1|.
  last_block_of_0->ForEachSuccessorLabel(
      [first_block_of_1](uint32_t* succ) { *succ = first_block_of_1->id(); });

  // Update the branch for the |last_block_of_loop_1| to go to the continue
  // block of |loop_0_|.
  last_block_of_1->ForEachSuccessorLabel(
      [this](uint32_t* succ) { *succ = loop_0_->GetContinueBlock()->id(); });

  // Update merge block id in the header of |loop_0_| to the merge block of
  // |loop_1_|.
  loop_0_->GetHeaderBlock()->ForEachInst([this](Instruction* inst) {
    if (inst->opcode() == spv::Op::OpLoopMerge) {
      inst->SetInOperand(0, {loop_1_->GetMergeBlock()->id()});
    }
  });

  // Update condition branch target in |loop_0_| to the merge block of
  // |loop_1_|.
  condition_block_of_0->ForEachInst([this](Instruction* inst) {
    if (inst->opcode() == spv::Op::OpBranchConditional) {
      auto loop_0_merge_block_id = loop_0_->GetMergeBlock()->id();

      if (inst->GetSingleWordInOperand(1) == loop_0_merge_block_id) {
        inst->SetInOperand(1, {loop_1_->GetMergeBlock()->id()});
      } else {
        inst->SetInOperand(2, {loop_1_->GetMergeBlock()->id()});
      }
    }
  });

  // Move OpPhi instructions not corresponding to the induction variable from
  // the header of |loop_1_| to the header of |loop_0_|.
  std::vector<Instruction*> instructions_to_move{};
  for (auto& instruction : *loop_1_->GetHeaderBlock()) {
    if (instruction.opcode() == spv::Op::OpPhi &&
        &instruction != induction_1_) {
      instructions_to_move.push_back(&instruction);
    }
  }

  for (auto& it : instructions_to_move) {
    it->RemoveFromList();
    it->InsertBefore(induction_0_);
  }

  // Update the OpPhi parents to the correct blocks in |loop_0_|.
  loop_0_->GetHeaderBlock()->ForEachPhiInst([this](Instruction* i) {
    ReplacePhiParentWith(i, loop_1_->GetPreHeaderBlock()->id(),
                         loop_0_->GetPreHeaderBlock()->id());

    ReplacePhiParentWith(i, loop_1_->GetContinueBlock()->id(),
                         loop_0_->GetContinueBlock()->id());
  });

  // Update instruction to block mapping & DefUseManager.
  for (auto& phi_instruction : instructions_to_move) {
    context_->set_instr_block(phi_instruction, loop_0_->GetHeaderBlock());
    context_->get_def_use_mgr()->AnalyzeInstUse(phi_instruction);
  }

  // Replace the uses of the induction variable of |loop_1_| with that the
  // induction variable of |loop_0_|.
  context_->ReplaceAllUsesWith(induction_1_->result_id(),
                               induction_0_->result_id());

  // Replace LCSSA OpPhi in merge block of |loop_0_|.
  loop_0_->GetMergeBlock()->ForEachPhiInst([this](Instruction* instruction) {
    context_->ReplaceAllUsesWith(instruction->result_id(),
                                 instruction->GetSingleWordInOperand(0));
  });

  // Update LCSSA OpPhi in merge block of |loop_1_|.
  loop_1_->GetMergeBlock()->ForEachPhiInst(
      [condition_block_of_0](Instruction* instruction) {
        instruction->SetInOperand(1, {condition_block_of_0->id()});
      });

  // Move the continue block of |loop_0_| after the last block of |loop_1_|.
  containing_function_->MoveBasicBlockToAfter(continue_0, last_block_of_1);

  // Gather all instructions to be killed from |loop_1_| (induction variable
  // initialisation, header, condition and continue blocks).
  std::vector<Instruction*> instr_to_delete{};
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetPreHeaderBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetHeaderBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->FindConditionBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetContinueBlock());

  // There was an additional empty block between the loops, kill that too.
  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    AddInstructionsInBlock(&instr_to_delete, loop_0_->GetMergeBlock());
  }

  // Update the CFG, so it wouldn't need invalidating.
  auto cfg = context_->cfg();

  cfg->ForgetBlock(loop_1_->GetPreHeaderBlock());
  cfg->ForgetBlock(loop_1_->GetHeaderBlock());
  cfg->ForgetBlock(loop_1_->FindConditionBlock());
  cfg->ForgetBlock(loop_1_->GetContinueBlock());

  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    cfg->ForgetBlock(loop_0_->GetMergeBlock());
  }

  cfg->RemoveEdge(last_block_of_0->id(), loop_0_->GetContinueBlock()->id());
  cfg->AddEdge(last_block_of_0->id(), first_block_of_1->id());

  cfg->AddEdge(last_block_of_1->id(), loop_0_->GetContinueBlock()->id());

  cfg->AddEdge(loop_0_->GetContinueBlock()->id(),
               loop_1_->GetHeaderBlock()->id());

  cfg->AddEdge(condition_block_of_0->id(), loop_1_->GetMergeBlock()->id());

  // Update DefUseManager.
  auto def_use_mgr = context_->get_def_use_mgr();

  // Uses of labels that are in updated branches need analysing.
  def_use_mgr->AnalyzeInstUse(last_block_of_0->terminator());
  def_use_mgr->AnalyzeInstUse(last_block_of_1->terminator());
  def_use_mgr->AnalyzeInstUse(loop_0_->GetHeaderBlock()->GetLoopMergeInst());
  def_use_mgr->AnalyzeInstUse(condition_block_of_0->terminator());

  // Update the LoopDescriptor, so it wouldn't need invalidating.
  auto ld = context_->GetLoopDescriptor(containing_function_);

  // Create a copy, so the iterator wouldn't be invalidated.
  std::vector<Loop*> loops_to_add_remove{};
  for (auto child_loop : *loop_1_) {
    loops_to_add_remove.push_back(child_loop);
  }

  for (auto child_loop : loops_to_add_remove) {
    loop_1_->RemoveChildLoop(child_loop);
    loop_0_->AddNestedLoop(child_loop);
  }

  auto loop_1_blocks = loop_1_->GetBlocks();

  for (auto block : loop_1_blocks) {
    loop_1_->RemoveBasicBlock(block);
    if (block != header_1 && block != condition_1 && block != continue_1) {
      loop_0_->AddBasicBlock(block);
      if ((*ld)[block] == loop_1_) {
        ld->SetBasicBlockToLoop(block, loop_0_);
      }
    }

    if ((*ld)[block] == loop_1_) {
      ld->ForgetBasicBlock(block);
    }
  }

  loop_1_->RemoveBasicBlock(loop_1_->GetPreHeaderBlock()->id());
  ld->ForgetBasicBlock(loop_1_->GetPreHeaderBlock()->id());

  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    loop_0_->RemoveBasicBlock(loop_0_->GetMergeBlock()->id());
    ld->ForgetBasicBlock(loop_0_->GetMergeBlock()->id());
  }

  loop_0_->SetMergeBlock(loop_1_->GetMergeBlock());

  loop_1_->ClearBlocks();

  ld->RemoveLoop(loop_1_);

  // Kill unnecessary instructions and remove all empty blocks.
  for (auto inst : instr_to_delete) {
    context_->KillInst(inst);
  }

  containing_function_->RemoveEmptyBlocks();

  // Invalidate analyses.
  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisInstrToBlockMapping |
      IRContext::Analysis::kAnalysisLoopAnalysis |
      IRContext::Analysis::kAnalysisDefUse | IRContext::Analysis::kAnalysisCFG);
}